

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caching_allocator.hpp
# Opt level: O0

void __thiscall
Al::internal::
CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
::CachingAllocator(CachingAllocator<(Al::internal::MemoryType)0,_Al::internal::HostMemoryAllocator,_Al::internal::CachingAllocatorDefaultParams>
                   *this)

{
  size_type sVar1;
  long in_RDI;
  vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
  *this_00;
  size_t i;
  ulong local_10;
  
  std::
  vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
  ::vector((vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
            *)0x133528);
  this_00 = (vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
             *)(in_RDI + 0x18);
  std::
  unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
  ::unordered_map((unordered_map<void_*,_unsigned_long,_std::hash<void_*>,_std::equal_to<void_*>,_std::allocator<std::pair<void_*const,_unsigned_long>_>_>
                   *)0x13353b);
  std::mutex::mutex((mutex *)0x133549);
  local_10 = 0;
  while( true ) {
    sVar1 = std::array<unsigned_long,_61UL>::size(&bin_sizes);
    if (sVar1 <= local_10) break;
    std::
    vector<std::vector<void_*,_std::allocator<void_*>_>,_std::allocator<std::vector<void_*,_std::allocator<void_*>_>_>_>
    ::emplace_back<>(this_00);
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

CachingAllocator() {
    for (size_t i = 0; i < bin_sizes.size(); ++i) {
      free_data.emplace_back();
    }
  }